

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O0

PolyNf * Inferences::PolynomialEvaluation::
         simplifySummation<Kernel::NumTraits<Kernel::IntegerConstantType>>
                   (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *summands
                   ,bool removeZeros)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar5;
  byte in_DL;
  __off_t __length;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_RSI;
  PolyNf *in_RDI;
  Polynom poly;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  factors;
  Numeral numeral;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> monom;
  uint i;
  int offs;
  undefined4 in_stack_fffffffffffffdd8;
  uint in_stack_fffffffffffffddc;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_fffffffffffffde0;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_fffffffffffffde8;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  *x;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  MonomFactor *in_stack_fffffffffffffdf8;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_fffffffffffffe00;
  IntegerConstantType *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_fffffffffffffe18;
  bool local_1c9;
  bool local_1b9;
  bool local_199;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_stack_fffffffffffffe68;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_stack_fffffffffffffe70;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_158 [2];
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  local_110 [2];
  undefined4 local_f0;
  byte local_e9;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  local_d8 [4];
  byte local_91;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  local_70 [4];
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  local_30;
  uint local_1c;
  int local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::begin(in_RSI);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::end(in_RSI);
  std::sort<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*>
            ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),in_stack_fffffffffffffde8
            );
  local_18 = 0;
  for (local_1c = 0; uVar3 = (ulong)local_1c,
      sVar4 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size
                        (in_RSI), uVar3 < sVar4; local_1c = local_1c + 1) {
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator[]
              (in_RSI,(ulong)local_1c);
    Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
              ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8);
    Kernel::IntegerConstantType::IntegerConstantType
              ((IntegerConstantType *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               &in_stack_fffffffffffffde8->numeral);
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
    ::Perfect(local_70,&local_30);
    while( true ) {
      in_stack_fffffffffffffe68 =
           (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
           (ulong)(local_1c + 1);
      in_stack_fffffffffffffe70 =
           (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
           Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size(in_RSI)
      ;
      local_199 = false;
      if (in_stack_fffffffffffffe68 < in_stack_fffffffffffffe70) {
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator[]
                  (in_RSI,(ulong)(local_1c + 1));
        local_199 = Lib::operator==((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
                                     *)in_stack_fffffffffffffde0,
                                    (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
                                     *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                   );
      }
      if (local_199 == false) break;
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator[]
                (in_RSI,(ulong)(local_1c + 1));
      Kernel::IntegerConstantType::operator+
                (in_stack_fffffffffffffe08,&in_stack_fffffffffffffe00->numeral);
      Kernel::IntegerConstantType::operator=
                (&in_stack_fffffffffffffde0->numeral,
                 (IntegerConstantType *)
                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x80a039);
      local_1c = local_1c + 1;
    }
    local_91 = 0;
    local_1b9 = true;
    if ((local_11 & 1) != 0) {
      Kernel::NumTraits<Kernel::IntegerConstantType>::constant(in_stack_fffffffffffffddc);
      local_91 = 1;
      local_1b9 = Kernel::operator!=(&in_stack_fffffffffffffde0->numeral,
                                     (IntegerConstantType *)
                                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    }
    if ((local_91 & 1) != 0) {
      Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x80a120);
    }
    if (local_1b9 != false) {
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)
                 CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                 &in_stack_fffffffffffffde8->numeral);
      Lib::
      Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
      ::Perfect(local_d8,local_70);
      Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
                (in_stack_fffffffffffffe00,(Numeral *)in_stack_fffffffffffffdf8,
                 (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
                  *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      sVar4 = (size_t)local_18;
      local_18 = local_18 + 1;
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator[]
                (in_RSI,sVar4);
      Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::operator=
                (in_stack_fffffffffffffde0,
                 (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Monom
                ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x80a1c2);
      Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x80a1cf);
    }
    Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x80a253);
    Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x80a260);
  }
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::truncate
            (in_RSI,(char *)(long)local_18,__length);
  sVar4 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size(in_RSI);
  local_e9 = 0;
  local_1c9 = false;
  if (sVar4 == 1) {
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator[]
              (in_RSI,0);
    Kernel::IntegerConstantType::IntegerConstantType
              ((IntegerConstantType *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               &in_stack_fffffffffffffde8->numeral);
    local_e9 = 1;
    local_f0 = 1;
    bVar1 = Kernel::operator==((IntegerConstantType *)
                               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                               (int *)in_stack_fffffffffffffe08);
    local_1c9 = false;
    if (bVar1) {
      pMVar5 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::
               operator[](in_RSI,0);
      in_stack_fffffffffffffe18 =
           Lib::
           Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
           ::operator->(&pMVar5->factors);
      uVar2 = Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::nFactors
                        ((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x80a36e);
      local_1c9 = false;
      if (uVar2 == 1) {
        pMVar5 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::
                 operator[](in_RSI,0);
        in_stack_fffffffffffffe00 =
             (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             Lib::
             Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
             ::operator->(&pMVar5->factors);
        in_stack_fffffffffffffdf8 =
             Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::factorAt
                       ((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                        in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
        local_1c9 = in_stack_fffffffffffffdf8->power == 1;
      }
    }
  }
  if ((local_e9 & 1) != 0) {
    Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x80a3f4);
  }
  if ((local_1c9 & 1U) == 0) {
    x = local_110;
    Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
              ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)in_stack_fffffffffffffe70
               ,in_stack_fffffffffffffe68);
    Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::integrity
              ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)x);
    Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
              (local_158,
               (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    Lib::
    perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
              ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)in_stack_fffffffffffffe18
              );
    Kernel::AnyPoly::AnyPoly<Kernel::NumTraits<Kernel::IntegerConstantType>>
              ((AnyPoly *)CONCAT17(local_1c9,in_stack_fffffffffffffdf0),x);
    Kernel::PolyNf::PolyNf((PolyNf *)in_stack_fffffffffffffe00,(AnyPoly *)in_stack_fffffffffffffdf8)
    ;
    Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Polynom
              ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x80a4fb);
    Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Polynom
              ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x80a508);
  }
  else {
    pMVar5 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator[]
                       (in_RSI,0);
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
    ::operator->(&pMVar5->factors);
    Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::factorAt
              ((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    Kernel::PolyNf::PolyNf
              ((PolyNf *)in_stack_fffffffffffffde0,
               (PolyNf *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  }
  return in_RDI;
}

Assistant:

PolyNf PolynomialEvaluation::simplifySummation(Stack<Monom<Number>> summands, bool removeZeros)
{ 
  using Monom   = Monom<Number>;
  using Polynom = Polynom<Number>;

  // then we sort them by their monom, in order to add up the coefficients efficiently
  std::sort(summands.begin(), summands.end());

  // add up the coefficients (in place)
  {
    auto offs = 0;
    for (unsigned i = 0; i < summands.size(); i++) { 
      auto monom = summands[i];
      auto numeral = monom.numeral;
      auto factors = monom.factors;
      while ( i + 1 < summands.size() && summands[i+1].factors == factors ) {
        numeral = numeral + summands[i+1].numeral;
        i++;
      }
      if (!removeZeros || numeral != Number::constant(0)) 
        summands[offs++] = Monom(numeral, factors);
    }
    summands.truncate(offs);
  }

  if (summands.size() == 1 
      && summands[0].numeral == 1
      && summands[0].factors->nFactors() == 1
      && summands[0].factors->factorAt(0).power == 1
      ) {
    return summands[0].factors->factorAt(0).term;
  } else {
    auto poly = Polynom(std::move(summands));
    poly.integrity();
    return PolyNf(AnyPoly(perfect(std::move(poly))));
  }
}